

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackSTGZGenerator.cxx
# Opt level: O1

void __thiscall cmCPackSTGZGenerator::cmCPackSTGZGenerator(cmCPackSTGZGenerator *this)

{
  string local_58;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"paxr","");
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,".sh","");
  cmCPackArchiveGenerator::cmCPackArchiveGenerator
            (&this->super_cmCPackArchiveGenerator,CompressGZip,&local_38,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  (this->super_cmCPackArchiveGenerator).super_cmCPackGenerator._vptr_cmCPackGenerator =
       (_func_int **)&PTR_GetNameOfClass_008c8b78;
  return;
}

Assistant:

cmCPackSTGZGenerator::cmCPackSTGZGenerator()
  : cmCPackArchiveGenerator(cmArchiveWrite::CompressGZip, "paxr", ".sh")
{
}